

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::~TextGenerator(TextGenerator *this)

{
  TextGenerator *this_local;
  
  if (((this->failed_ & 1U) == 0) && (0 < this->buffer_size_)) {
    (*this->output_->_vptr_ZeroCopyOutputStream[3])(this->output_,(ulong)(uint)this->buffer_size_);
  }
  std::__cxx11::string::~string((string *)&this->indent_);
  return;
}

Assistant:

~TextGenerator() {
    // Only BackUp() if we're sure we've successfully called Next() at least
    // once.
    if (!failed_ && buffer_size_ > 0) {
      output_->BackUp(buffer_size_);
    }
  }